

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadMessage.cpp
# Opt level: O0

bool __thiscall ReadMessage::fillMe(ReadMessage *this,string *parameter)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string *parameter_local;
  ReadMessage *this_local;
  
  if (this->ParameterCount == 0) {
    uVar2 = std::__cxx11::string::length();
    if ((9 < uVar2) || (uVar2 = std::__cxx11::string::length(), uVar2 < 2)) {
      std::__cxx11::string::operator=
                ((string *)&(this->super_ServerOperation).statusMessage,
                 "Invalid User - Max 8 Characters!");
      return false;
    }
    std::__cxx11::string::operator=((string *)&this->User,(string *)parameter);
    std::__cxx11::string::pop_back();
    this->ParameterCount = this->ParameterCount + 1;
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,"Message-number:");
  }
  else if (this->ParameterCount == 1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)parameter);
      iVar1 = isdigit((int)*pcVar3);
      if ((iVar1 != 0) &&
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)parameter), *pcVar3 != '0')) {
        iVar1 = std::__cxx11::stoi(parameter,(size_t *)0x0,10);
        this->MessageNumber = iVar1;
        this->ParameterCount = this->ParameterCount + 1;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_ServerOperation).statusMessage,
                   (this->super_ServerOperation).EXECUTEPENDING);
        goto LAB_001051cb;
      }
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,
               "Invalid Message Number - Must be integer bigger than 0!");
    return false;
  }
LAB_001051cb:
  return this->ParameterCount != 2;
}

Assistant:

bool ReadMessage::fillMe(string parameter) {
    //fill the needed parameter
    if(ParameterCount == 0){
        if(parameter.length() <= 9 && parameter.length() > 1){ //is the Username given 1-8 chars long?
            User = parameter;
            User.pop_back();
            ParameterCount ++;
            statusMessage = "Message-number:";
        }
        else{
            statusMessage = "Invalid User - Max 8 Characters!";
            return false;
        }
    }
    else if(ParameterCount == 1){
        if(!parameter.empty() && isdigit(parameter[0]) && parameter[0] != '0'){ //is the parameter even a number bigger than 0?
            MessageNumber = stoi(parameter);
            ParameterCount ++;
            statusMessage = EXECUTEPENDING;
        }
        else{
            statusMessage = "Invalid Message Number - Must be integer bigger than 0!";
            return false;
        }
    }

    //check if ready and return true if != 2 and false if all parameters were given
    return ParameterCount != 2;
}